

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
ManySubcommands_Unlimited_Test::~ManySubcommands_Unlimited_Test
          (ManySubcommands_Unlimited_Test *this)

{
  ManySubcommands_Unlimited_Test *this_local;
  
  ~ManySubcommands_Unlimited_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(ManySubcommands, Unlimited) {
    run();
    EXPECT_EQ(app.remaining(true), vs_t());

    app.reset();
    app.require_subcommand();

    run();
    EXPECT_EQ(app.remaining(true), vs_t());

    app.reset();
    app.require_subcommand(2, 0); // 2 or more

    run();
    EXPECT_EQ(app.remaining(true), vs_t());
}